

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O2

void silly_thing(char *word,obj *otmp)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  bVar1 = otmp->oclass;
  uVar2 = otmp->otyp;
  if (bVar1 == 3) {
    iVar3 = strcmp(word,"put on");
    if (iVar3 != 0) {
      iVar3 = strcmp(word,"remove");
      if (iVar3 != 0) goto LAB_001a94a9;
      pcVar6 = "T";
      pcVar5 = "take";
      pcVar7 = " off";
      goto LAB_001a94fa;
    }
    pcVar6 = "ELAM EBOW";
    pcVar5 = "wear";
  }
  else {
    if (((((bVar1 & 0xfe) != 4) && (uVar2 != 0xed)) && (uVar2 != 0x113)) &&
       ((uVar2 & 0xfffe) != 0xee)) {
LAB_001a94a9:
      pline("That is a silly thing to %s.",word);
      return;
    }
    iVar3 = strcmp(word,"wear");
    if (iVar3 == 0) {
      pcVar6 = "P";
      pcVar5 = "put";
      pcVar7 = " on";
      goto LAB_001a94fa;
    }
    iVar3 = strcmp(word,"take off");
    if (iVar3 != 0) goto LAB_001a94a9;
    pcVar6 = "ZELGO MER";
    pcVar5 = "remove";
  }
  pcVar6 = pcVar6 + 8;
  pcVar7 = "";
LAB_001a94fa:
  if ((uVar2 == 0xed) ||
     ((pcVar4 = "that", bVar1 == 3 && ((byte)(objects[(short)uVar2].oc_subtyp - 3U) < 2)))) {
    pcVar4 = "those";
  }
  pline("Use the \'%s\' command to %s %s%s.",pcVar6,pcVar5,pcVar4,pcVar7);
  return;
}

Assistant:

void silly_thing(const char *word, struct obj *otmp)
{
	const char *s1, *s2, *s3, *what;
	int ocls = otmp->oclass, otyp = otmp->otyp;

	s1 = s2 = s3 = 0;
	/* check for attempted use of accessory commands ('P','R') on armor
	   and for corresponding armor commands ('W','T') on accessories */
	if (ocls == ARMOR_CLASS) {
	    if (!strcmp(word, "put on"))
		s1 = "W", s2 = "wear", s3 = "";
	    else if (!strcmp(word, "remove"))
		s1 = "T", s2 = "take", s3 = " off";
	} else if ((ocls == RING_CLASS || otyp == MEAT_RING) ||
		ocls == AMULET_CLASS ||
		(otyp == BLINDFOLD || otyp == TOWEL || otyp == LENSES)) {
	    if (!strcmp(word, "wear"))
		s1 = "P", s2 = "put", s3 = " on";
	    else if (!strcmp(word, "take off"))
		s1 = "R", s2 = "remove", s3 = "";
	}
	if (s1) {
	    what = "that";
	    /* quantity for armor and accessory objects is always 1,
	       but some things should be referred to as plural */
	    if (otyp == LENSES || is_gloves(otmp) || is_boots(otmp))
		what = "those";
	    pline("Use the '%s' command to %s %s%s.", s1, s2, what, s3);
	} else {
	    pline("That is a silly thing to %s.", word);
	}
}